

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::Compressed2DFormatCase::iterate(Compressed2DFormatCase *this)

{
  int preferredHeight;
  TestLog *pTVar1;
  RenderContext *context;
  bool bVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  undefined4 extraout_var_02;
  byte bVar7;
  char *description;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  RandomViewport viewport;
  Surface renderedFrame;
  vector<float,_std::allocator<float>_> texCoord;
  Surface referenceFrame;
  RandomViewport local_168;
  long local_158;
  Surface local_150;
  vector<float,_std::allocator<float>_> local_138;
  TestLog *local_118;
  Surface local_110;
  SurfaceAccess local_f8;
  ReferenceParams local_d8;
  Texture2DView local_40;
  undefined4 extraout_var_01;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  local_158 = CONCAT44(extraout_var,iVar3);
  pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = (this->m_texture->m_refTexture).m_width;
  preferredHeight = (this->m_texture->m_refTexture).m_height;
  dVar5 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_168,(RenderTarget *)CONCAT44(extraout_var_00,iVar4),iVar3,preferredHeight,dVar5)
  ;
  tcu::Surface::Surface(&local_150,local_168.width,local_168.height);
  tcu::Surface::Surface(&local_110,local_168.width,local_168.height);
  local_118 = pTVar1;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar6 = CONCAT44(extraout_var_01,iVar3);
  bVar7 = 8 - *(char *)(lVar6 + 8);
  uVar8 = 0x1000000 << (8U - (char)*(int *)(lVar6 + 0x14) & 0x1f);
  if (*(int *)(lVar6 + 0x14) < 1) {
    uVar8 = 0;
  }
  uVar10 = 0x100 << (8U - *(char *)(lVar6 + 0xc) & 0x1f) | 1 << (bVar7 & 0x1f);
  uVar8 = 0x10000 << (8U - *(char *)(lVar6 + 0x10) & 0x1f) | uVar10 | uVar8;
  uVar9 = 1 << (bVar7 & 0x1f) & 0xff;
  if (0xfd < uVar9) {
    uVar9 = 0xfe;
  }
  uVar10 = uVar10 >> 8 & 0xff;
  if (0xfd < uVar10) {
    uVar10 = 0xfe;
  }
  uVar11 = uVar8 >> 0x10 & 0xff;
  if (0xfd < uVar11) {
    uVar11 = 0xfe;
  }
  uVar8 = uVar8 >> 0x18;
  if (0xfd < uVar8) {
    uVar8 = 0xfe;
  }
  local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d8.super_RenderParams.texType = TEXTURETYPE_2D;
  local_d8.super_RenderParams.samplerType = SAMPLERTYPE_FLOAT;
  local_f8.m_surface = (Surface *)0x3f8000003f800000;
  glu::TextureTestUtil::computeQuadTexCoord2D(&local_138,(Vec2 *)&local_d8,(Vec2 *)&local_f8);
  lVar6 = local_158;
  (**(code **)(local_158 + 0x1a00))(local_168.x,local_168.y,local_168.width,local_168.height);
  (**(code **)(lVar6 + 8))(0x84c0);
  (**(code **)(lVar6 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2800,0x2600);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFormatTests.cpp"
                  ,0x1d9);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,
             local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,TEXTURETYPE_2D);
  context = this->m_renderCtx;
  local_f8.m_surface = (Surface *)0x300000008;
  if ((void *)local_150.m_pixels.m_cap != (void *)0x0) {
    local_150.m_pixels.m_cap = (size_t)local_150.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_d8,(TextureFormat *)&local_f8,local_150.m_width,
             local_150.m_height,1,(void *)local_150.m_pixels.m_cap);
  glu::readPixels(context,local_168.x,local_168.y,(PixelBufferAccess *)&local_d8);
  dVar5 = (**(code **)(local_158 + 0x800))();
  glu::checkError(dVar5,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFormatTests.cpp"
                  ,0x1de);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_d8,TEXTURETYPE_2D);
  local_d8.sampler.wrapS = CLAMP_TO_EDGE;
  local_d8.sampler.wrapT = CLAMP_TO_EDGE;
  local_d8.sampler.wrapR = CLAMP_TO_EDGE;
  local_d8.sampler.minFilter = NEAREST;
  local_d8.sampler.magFilter = NEAREST;
  local_d8.sampler.lodThreshold = 0.0;
  local_d8.sampler.normalizedCoords = true;
  local_d8.sampler.compare = COMPAREMODE_NONE;
  local_d8.sampler.compareChannel = 0;
  local_d8.sampler.borderColor.v._0_8_ = 0;
  local_d8.sampler.borderColor.v._8_8_ = 0;
  local_d8.sampler.seamlessCubeMap = false;
  local_d8.sampler._53_3_ = 0;
  local_d8.sampler.depthStencilMode = MODE_DEPTH;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            (&local_f8,&local_110,(PixelFormat *)(CONCAT44(extraout_var_02,iVar3) + 8));
  local_40.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
  local_40.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
  glu::TextureTestUtil::sampleTexture
            (&local_f8,&local_40,
             local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_d8);
  bVar2 = glu::TextureTestUtil::compareImages
                    (local_118,&local_110,&local_150,
                     (RGBA)(uVar8 * 0x1000000 + (uVar11 << 0x10 | uVar10 * 0x100 + uVar9) +
                           0x1010101));
  description = "Image comparison failed";
  if (bVar2) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)!bVar2,description);
  if (local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_110);
  tcu::Surface::~Surface(&local_150);
  return STOP;
}

Assistant:

Compressed2DFormatCase::IterateResult Compressed2DFormatCase::iterate (void)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), m_texture->getRefTexture().getWidth(), m_texture->getRefTexture().getHeight(), deStringHash(getName()));
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);
	tcu::Surface			referenceFrame		(viewport.width, viewport.height);
	tcu::RGBA				threshold			= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>			texCoord;

	computeQuadTexCoord2D(texCoord, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Draw.
	m_renderer.renderQuad(0, &texCoord[0], TEXTURETYPE_2D);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels()");

	// Compute reference.
	ReferenceParams refParams(TEXTURETYPE_2D);
	refParams.sampler = Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], refParams);

	// Compare and log.
	bool isOk = compareImages(log, referenceFrame, renderedFrame, threshold);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");

	return STOP;
}